

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strncpy.c
# Opt level: O2

char * strncpy(char *__dest,char *__src,size_t __n)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  char *rc;
  ulong uVar4;
  
  lVar2 = 0;
  do {
    uVar4 = __n - lVar2;
    if (uVar4 == 0) {
      pcVar3 = __dest + lVar2;
LAB_001035dd:
      for (; 1 < uVar4; uVar4 = uVar4 - 1) {
        *pcVar3 = '\0';
        pcVar3 = pcVar3 + 1;
      }
      return __dest;
    }
    cVar1 = __src[lVar2];
    __dest[lVar2] = cVar1;
    if (cVar1 == '\0') {
      pcVar3 = __dest + lVar2 + 1;
      goto LAB_001035dd;
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

char * strncpy( char * _PDCLIB_restrict s1, const char * _PDCLIB_restrict s2, size_t n )
{
    char * rc = s1;

    while ( n && ( *s1++ = *s2++ ) )
    {
        /* Cannot do "n--" in the conditional as size_t is unsigned and we have
           to check it again for >0 in the next loop below, so we must not risk
           underflow.
        */
        --n;
    }

    /* Checking against 1 as we missed the last --n in the loop above. */
    while ( n-- > 1 )
    {
        *s1++ = '\0';
    }

    return rc;
}